

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeInitPage(MemPage *pPage)

{
  int iVar1;
  MemPage *pPage_00;
  undefined1 *in_RDI;
  BtShared *pBt;
  u8 *data;
  long lVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar2 = *(long *)(in_RDI + 0x48);
  pPage_00 = (MemPage *)(*(long *)(in_RDI + 0x50) + (long)(int)(uint)(byte)in_RDI[9]);
  iVar1 = decodeFlags(pPage_00,(int)((ulong)lVar2 >> 0x20));
  if (iVar1 == 0) {
    *(short *)(in_RDI + 0x1a) = (short)*(undefined4 *)(lVar2 + 0x34) + -1;
    in_RDI[0xc] = 0;
    *(ushort *)(in_RDI + 0x12) = (byte)in_RDI[9] + 8 + (ushort)(byte)in_RDI[10];
    *(long *)(in_RDI + 0x60) = (long)pPage_00->aiOvfl + (long)(int)(uint)(byte)in_RDI[10] + -0x14;
    *(ulong *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x50) + (ulong)*(uint *)(lVar2 + 0x34);
    *(long *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x50) + (long)(int)(uint)(byte)in_RDI[10];
    *(ushort *)(in_RDI + 0x18) = CONCAT11(pPage_00->field_0x3,(char)pPage_00->pgno);
    if ((*(int *)(lVar2 + 0x34) - 8U) / 6 < (uint)*(ushort *)(in_RDI + 0x18)) {
      iVar1 = sqlite3CorruptError(0);
    }
    else {
      *(undefined4 *)(in_RDI + 0x14) = 0xffffffff;
      *in_RDI = 1;
      if ((*(ulong *)(*(long *)(lVar2 + 8) + 0x30) & 0x200000) == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = btreeCellSizeCheck((MemPage *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
    }
  }
  else {
    iVar1 = sqlite3CorruptError(0);
  }
  return iVar1;
}

Assistant:

static int btreeInitPage(MemPage *pPage){
  u8 *data;          /* Equal to pPage->aData */
  BtShared *pBt;        /* The main btree structure */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==0 );

  pBt = pPage->pBt;
  data = pPage->aData + pPage->hdrOffset;
  /* EVIDENCE-OF: R-28594-02890 The one-byte flag at offset 0 indicating
  ** the b-tree page type. */
  if( decodeFlags(pPage, data[0]) ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nOverflow = 0;
  pPage->cellOffset = pPage->hdrOffset + 8 + pPage->childPtrSize;
  pPage->aCellIdx = data + pPage->childPtrSize + 8;
  pPage->aDataEnd = pPage->aData + pBt->pageSize;
  pPage->aDataOfst = pPage->aData + pPage->childPtrSize;
  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  pPage->nCell = get2byte(&data[3]);
  if( pPage->nCell>MX_CELL(pBt) ){
    /* To many cells for a single page.  The page must be corrupt */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  testcase( pPage->nCell==MX_CELL(pBt) );
  /* EVIDENCE-OF: R-24089-57979 If a page contains no cells (which is only
  ** possible for a root page of a table that contains no rows) then the
  ** offset to the cell content area will equal the page size minus the
  ** bytes of reserved space. */
  assert( pPage->nCell>0
       || get2byteNotZero(&data[5])==(int)pBt->usableSize
       || CORRUPT_DB );
  pPage->nFree = -1;  /* Indicate that this value is yet uncomputed */
  pPage->isInit = 1;
  if( pBt->db->flags & SQLITE_CellSizeCk ){
    return btreeCellSizeCheck(pPage);
  }
  return SQLITE_OK;
}